

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O0

TableStorageInfo * __thiscall duckdb::DataTable::GetStorageInfo(DataTable *this)

{
  TableIndexList *in_RSI;
  TableStorageInfo *in_RDI;
  TableStorageInfo *result;
  TableStorageInfo *in_stack_ffffffffffffffa0;
  idx_t in_stack_ffffffffffffffd8;
  optional_idx *in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar1;
  
  uVar1 = 0;
  TableStorageInfo::TableStorageInfo(in_stack_ffffffffffffffa0);
  GetTotalRows((DataTable *)0xc3f769);
  optional_idx::optional_idx(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  (in_RDI->cardinality).index = (idx_t)in_stack_ffffffffffffffe0;
  shared_ptr<duckdb::DataTableInfo,_true>::operator->
            ((shared_ptr<duckdb::DataTableInfo,_true> *)in_stack_ffffffffffffffa0);
  TableIndexList::Scan<duckdb::DataTable::GetStorageInfo()::__0>
            (in_RSI,(anon_class_8_1_6971b95b *)CONCAT17(uVar1,in_stack_ffffffffffffffe8));
  return in_RDI;
}

Assistant:

TableStorageInfo DataTable::GetStorageInfo() {
	TableStorageInfo result;
	result.cardinality = GetTotalRows();
	info->indexes.Scan([&](Index &index) {
		IndexInfo index_info;
		index_info.is_primary = index.IsPrimary();
		index_info.is_unique = index.IsUnique() || index_info.is_primary;
		index_info.is_foreign = index.IsForeign();
		index_info.column_set = index.GetColumnIdSet();
		result.index_info.push_back(std::move(index_info));
		return false;
	});
	return result;
}